

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

_Bool object_has_rune(object *obj,wchar_t rune_no)

{
  byte bVar1;
  short sVar2;
  _Bool *p_Var3;
  rune *prVar4;
  _Bool _Var5;
  int iVar6;
  angband_constants *paVar7;
  char **ppcVar8;
  ulong uVar9;
  
  prVar4 = rune_list;
  switch(rune_list[rune_no].variety) {
  case RUNE_VAR_COMBAT:
    iVar6 = rune_list[rune_no].index;
    if (iVar6 == 1) {
      _Var5 = object_has_standard_to_h(obj);
      if (!_Var5) {
        return true;
      }
      iVar6 = prVar4[rune_no].index;
    }
    else if (iVar6 == 0) {
      sVar2 = obj->to_a;
      goto joined_r0x0019a16e;
    }
    if (iVar6 == 3) {
      _Var5 = object_has_standard_ac(obj);
      if (!_Var5) {
        return true;
      }
      iVar6 = prVar4[rune_no].index;
    }
    else if (iVar6 == 2) {
      sVar2 = obj->to_d;
      goto joined_r0x0019a16e;
    }
    if ((iVar6 == 4) && (_Var5 = object_has_standard_dice(obj), !_Var5)) {
      return true;
    }
    break;
  case RUNE_VAR_MOD:
    sVar2 = obj->modifiers[rune_list[rune_no].index];
joined_r0x0019a16e:
    if (sVar2 != 0) {
      return true;
    }
    break;
  case RUNE_VAR_RESIST:
    if (obj->el_info[rune_list[rune_no].index].res_level != 100) {
      return true;
    }
    break;
  case RUNE_VAR_BRAND:
    p_Var3 = obj->brands;
    if (p_Var3 != (_Bool *)0x0) {
      bVar1 = z_info->brand_max;
      ppcVar8 = &brands->name;
      for (uVar9 = 0; bVar1 != uVar9; uVar9 = uVar9 + 1) {
        if ((p_Var3[uVar9] == true) && (iVar6 = strcmp(*ppcVar8,prVar4[rune_no].name), iVar6 == 0))
        {
          return true;
        }
        ppcVar8 = ppcVar8 + 6;
      }
    }
    break;
  case RUNE_VAR_SLAY:
    if (obj->slays != (_Bool *)0x0) {
      paVar7 = z_info;
      for (uVar9 = 0; uVar9 < paVar7->slay_max; uVar9 = uVar9 + 1) {
        if ((obj->slays[uVar9] == true) &&
           (_Var5 = same_monsters_slain(prVar4[rune_no].index,(wchar_t)uVar9), paVar7 = z_info,
           _Var5)) {
          return true;
        }
      }
    }
    break;
  case RUNE_VAR_CURSE:
    if ((obj->curses != (curse_data *)0x0) && (obj->curses[rune_list[rune_no].index].power != L'\0')
       ) {
      return true;
    }
    break;
  case RUNE_VAR_FLAG:
    _Var5 = flag_has_dbg(obj->flags,6,rune_list[rune_no].index,"obj->flags","r->index");
    if (_Var5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool object_has_rune(const struct object *obj, int rune_no)
{
	struct rune *r = &rune_list[rune_no];

	switch (r->variety) {
		/* Combat runes - just check them all */
		case RUNE_VAR_COMBAT: {
			if ((r->index == COMBAT_RUNE_TO_A) && (obj->to_a))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_H) &&
					 !object_has_standard_to_h(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_D) && (obj->to_d))
				return true;
			else if ((r->index == COMBAT_RUNE_AC) &&
					 !object_has_standard_ac(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_DICE) &&
					 !object_has_standard_dice(obj))
				return true;
			break;
		}
		/* Mod runes */
		case RUNE_VAR_MOD: {
			if (obj->modifiers[r->index] != 0)
				return true;
			break;
		}
		/* Element runes */
		case RUNE_VAR_RESIST: {
			if (obj->el_info[r->index].res_level != RES_LEVEL_BASE)
				return true;
			break;
		}
		/* Brand runes */
		case RUNE_VAR_BRAND: {
			if (obj->brands) {
				int i;
				for (i = 0; i < z_info->brand_max; i++) {
					if (obj->brands[i] && streq(brands[i].name, r->name)) {
						return true;
					}
				}
			}
			break;
		}
		/* Slay runes */
		case RUNE_VAR_SLAY: {
			if (obj->slays) {
				int i;
				for (i = 0; i < z_info->slay_max; i++) {
					if (obj->slays[i] && same_monsters_slain(r->index, i)) {
						return true;
					}
				}
			}
			break;
		}
		/* Curse runes */
		case RUNE_VAR_CURSE: {
			if (obj->curses && obj->curses[r->index].power)
				return true;
			break;
		}
		/* Flag runes */
		case RUNE_VAR_FLAG: {
			if (of_has(obj->flags, r->index))
				return true;
			break;
		}
		default: break;
	}

	return false;
}